

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O2

void pele::physics::turbinflow::TurbInflow::read_one_turb_plane(TurbParm *a_tp,int iplane,int k)

{
  FArrayBox *pFVar1;
  undefined8 uVar2;
  char cVar3;
  int destcomp;
  string turb_data;
  Box srcBox;
  FArrayBox tmp;
  Box dstBox;
  ifstream ifs;
  int aiStack_218 [122];
  
  std::operator+(&turb_data,&a_tp->m_turb_file,"/DAT");
  std::ifstream::ifstream(&ifs,turb_data._M_dataplus._M_p,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                   "Unable to open input file ",&turb_data);
    amrex::Abort((string *)&tmp);
    std::__cxx11::string::~string((string *)&tmp);
  }
  pFVar1 = a_tp->sdata;
  dstBox.smallend.vect._0_8_ = *(undefined8 *)(pFVar1->super_BaseFab<double>).domain.smallend.vect;
  uVar2 = *(undefined8 *)(pFVar1->super_BaseFab<double>).domain.bigend.vect;
  dstBox.bigend.vect[0] = (int)uVar2;
  dstBox.bigend.vect[1] = (int)((ulong)uVar2 >> 0x20);
  dstBox.btype.itype =
       (uint)((ulong)*(undefined8 *)((pFVar1->super_BaseFab<double>).domain.bigend.vect + 2) >> 0x20
             );
  dstBox.bigend.vect[2] = iplane;
  dstBox.smallend.vect[2] = iplane;
  for (destcomp = 0; destcomp != 3; destcomp = destcomp + 1) {
    std::istream::seekg((long)&ifs,(_Ios_Seekdir)a_tp->offset[a_tp->kmax * destcomp + k + 1]);
    if (*(int *)((long)aiStack_218 + *(long *)(_ifs + -0x18)) != 0) {
      amrex::Abort_host("getplane(): seekg() failed");
    }
    amrex::FArrayBox::FArrayBox((FArrayBox *)&tmp.super_BaseFab<double>);
    amrex::FArrayBox::readFrom((FArrayBox *)&tmp.super_BaseFab<double>,(istream *)&ifs);
    srcBox.bigend.vect[2] = tmp.super_BaseFab<double>.domain.bigend.vect[2];
    srcBox.btype.itype = tmp.super_BaseFab<double>.domain.btype.itype;
    srcBox.smallend.vect[0] = tmp.super_BaseFab<double>.domain.smallend.vect[0];
    srcBox.smallend.vect[1] = tmp.super_BaseFab<double>.domain.smallend.vect[1];
    amrex::BaseFab<double>::copy<(amrex::RunOn)0>
              (&a_tp->sdata->super_BaseFab<double>,&tmp.super_BaseFab<double>,&srcBox,0,&dstBox,
               destcomp,1);
    amrex::BaseFab<double>::~BaseFab(&tmp.super_BaseFab<double>);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&turb_data);
  return;
}

Assistant:

void
TurbInflow::read_one_turb_plane(TurbParm& a_tp, int iplane, int k)
{
  // There are AMREX_SPACEDIM * kmax planes of FABs.
  // The first component are in the first kmax planes,
  // the second component in the next kmax planes, ....
  // Note also that both (*plane) and (*ncomp) start from
  // 1 not 0 since they're passed from Fortran.

  std::string turb_data = a_tp.m_turb_file + "/DAT";
  std::ifstream ifs(turb_data.c_str());
  if (!ifs.is_open()) {
    amrex::Abort("Unable to open input file " + turb_data);
  }

  amrex::Box dstBox = a_tp.sdata->box();
  dstBox.setSmall(2, iplane);
  dstBox.setBig(2, iplane);

  for (int n = 0; n < AMREX_SPACEDIM; ++n) {

    const long offset_idx = (k + 1) + (n * a_tp.kmax);
    AMREX_ASSERT_WITH_MESSAGE(
      offset_idx < a_tp.offset_size, "Bad turb fab offset idx");

    const long start = a_tp.offset[offset_idx];

    ifs.seekg(start, std::ios::beg);

    if (!ifs.good()) {
      amrex::Abort("getplane(): seekg() failed");
    }

    amrex::FArrayBox tmp;
    tmp.readFrom(ifs);
    amrex::Box srcBox = tmp.box();

    a_tp.sdata->copy<amrex::RunOn::Device>(tmp, srcBox, 0, dstBox, n, 1);
  }
  ifs.close();
}